

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

void __thiscall server::ctfservmode::died(ctfservmode *this,clientinfo *ci,clientinfo *actor)

{
  int iVar1;
  flag *pfVar2;
  clientinfo *local_48;
  int local_28;
  int local_24;
  int i_1;
  int i;
  clientinfo *actor_local;
  clientinfo *ci_local;
  ctfservmode *this_local;
  
  if ((this->notgotflags & 1U) == 0) {
    if (((-4 < gamemode) && (gamemode < 0x17)) &&
       ((gamemodes[gamemode + 3].flags & 0x500U) == 0x500)) {
      for (local_24 = 0; iVar1 = vector<server::ctfservmode::flag>::length(&this->flags),
          local_24 < iVar1; local_24 = local_24 + 1) {
        pfVar2 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_24);
        if (pfVar2->owner == ci->clientnum) {
          deadflag(this,local_24);
        }
      }
    }
    if (((((ctftkpenalty == 0) || (actor == (clientinfo *)0x0)) ||
         ((actor == ci || ((gamemode < -3 || (0x16 < gamemode)))))) ||
        ((gamemodes[gamemode + 3].flags & 1U) == 0)) ||
       (iVar1 = strcmp(actor->team,ci->team), local_48 = actor, iVar1 != 0)) {
      local_48 = (clientinfo *)0x0;
    }
    dropflag(this,ci,local_48);
    for (local_28 = 0; iVar1 = vector<server::ctfservmode::flag>::length(&this->flags),
        local_28 < iVar1; local_28 = local_28 + 1) {
      pfVar2 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_28);
      if (pfVar2->dropper == ci->clientnum) {
        pfVar2 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_28);
        pfVar2->dropper = -1;
        pfVar2 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_28);
        pfVar2->dropcount = 0;
      }
    }
  }
  return;
}

Assistant:

void died(clientinfo *ci, clientinfo *actor)
    {
        if(notgotflags) return;
        if(m_hold) loopv(flags) if(flags[i].owner==ci->clientnum) deadflag(i);
        dropflag(ci, ctftkpenalty && actor && actor != ci && isteam(actor->team, ci->team) ? actor : NULL);
        loopv(flags) if(flags[i].dropper == ci->clientnum) { flags[i].dropper = -1; flags[i].dropcount = 0; }
    }